

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateDisconnect(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    helics::Federate::finalize(this);
  }
  return;
}

Assistant:

void helicsFederateDisconnect(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->finalize();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}